

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

void reportInfo(FILE *file,vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,
               HighsFileType file_type)

{
  HighsInfoType HVar1;
  InfoRecordDouble *info;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (ulong)((long)(info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(info_records->
                       super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar4 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    info = (InfoRecordDouble *)
           (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar4];
    HVar1 = (info->super_InfoRecord).type;
    if (HVar1 == kInt) {
      reportInfo(file,(InfoRecordInt *)info,file_type);
    }
    else if (HVar1 == kInt64) {
      reportInfo(file,(InfoRecordInt64 *)info,file_type);
    }
    else {
      reportInfo(file,info,file_type);
    }
  }
  return;
}

Assistant:

void reportInfo(FILE* file, const std::vector<InfoRecord*>& info_records,
                const HighsFileType file_type) {
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    HighsInfoType type = info_records[index]->type;
    if (type == HighsInfoType::kInt64) {
      reportInfo(file, ((InfoRecordInt64*)info_records[index])[0], file_type);
    } else if (type == HighsInfoType::kInt) {
      reportInfo(file, ((InfoRecordInt*)info_records[index])[0], file_type);
    } else {
      reportInfo(file, ((InfoRecordDouble*)info_records[index])[0], file_type);
    }
  }
}